

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::AddPathToFileSet<cmValue>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,cmValue value,
          string_view fileSetType,string_view description,Action action)

{
  cmMakefile *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  cmFileSet *this_00;
  bool bVar2;
  string *psVar3;
  undefined1 local_118 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e8;
  _Base_ptr local_b8;
  string local_b0;
  cmTargetInternals *local_90;
  __node_base local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  string local_60;
  cmFileSet *local_40;
  cmFileSet *fileSet;
  string *fileSetName_local;
  cmTarget *self_local;
  cmTargetInternals *this_local;
  string_view fileSetType_local;
  cmValue value_local;
  
  fileSetType_local._M_len = (size_t)fileSetType._M_str;
  this_local = (cmTargetInternals *)fileSetType._M_len;
  fileSet = (cmFileSet *)fileSetName;
  fileSetName_local = (string *)self;
  self_local = (cmTarget *)this;
  fileSetType_local._M_str = (char *)value.Value;
  local_40 = cmTarget::GetFileSet(self,fileSetName);
  if (local_40 == (cmFileSet *)0x0) {
    pcVar1 = this->Makefile;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[26]>
              (&local_60,&description,(char (*) [26])0x1144a46);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    psVar3 = cmFileSet::GetType_abi_cxx11_(local_40);
    local_80 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    local_90 = this_local;
    local_88._M_nxt = (_Hash_node_base *)fileSetType_local._M_len;
    __y._M_str = (char *)fileSetType_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar2 = std::operator!=(local_80,__y);
    if (bVar2) {
      pcVar1 = this->Makefile;
      cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[19],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
                (&local_b0,(char (*) [11])"File set \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fileSet,
                 (char (*) [19])"\" is not of type \"",
                 (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (char (*) [3])0x111e91e);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      if (action == Set) {
        cmFileSet::ClearFileEntries(local_40);
      }
      local_b8 = (_Base_ptr)fileSetType_local._M_str;
      bVar2 = cmNonempty((cmValue)fileSetType_local._M_str);
      this_00 = local_40;
      if (bVar2) {
        psVar3 = cmValue::operator_cast_to_string_((cmValue *)&fileSetType_local._M_str);
        std::__cxx11::string::string((string *)(local_118 + 0x10),(string *)psVar3);
        cmMakefile::GetBacktrace((cmMakefile *)local_118);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_118 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_118 + 0x10),(cmListFileBacktrace *)local_118);
        cmFileSet::AddFileEntry
                  (this_00,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_118 + 0x30));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_118 + 0x30));
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_118);
        std::__cxx11::string::~string((string *)(local_118 + 0x10));
      }
    }
  }
  return;
}

Assistant:

void cmTargetInternals::AddPathToFileSet(cmTarget* self,
                                         std::string const& fileSetName,
                                         ValueType value,
                                         cm::string_view fileSetType,
                                         cm::string_view description,
                                         FileSetType::Action action)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (action == FileSetType::Action::Set) {
    fileSet->ClearFileEntries();
  }
  if (cmNonempty(value)) {
    fileSet->AddFileEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}